

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::drawOneIteration
          (MultisampleRenderCase *this)

{
  TextureFormat TVar1;
  size_type *psVar2;
  size_t *psVar3;
  ShaderProgram *pSVar4;
  RenderContext *pRVar5;
  int iVar6;
  deUint32 dVar7;
  RenderTarget RVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 extraout_var;
  long *plVar12;
  TextureFormat *pTVar13;
  undefined8 *puVar14;
  TestLog *pTVar15;
  _Rb_tree_node_base *p_Var16;
  TestError *pTVar17;
  long *plVar18;
  ulong *puVar19;
  size_t *psVar20;
  ulong uVar21;
  undefined8 uVar22;
  void *pvVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  Surface resultImage;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_298;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  ShaderProgram *local_260;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  int local_234;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  string sectionDescription;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  undefined1 local_1d0 [8];
  pointer local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [4];
  ios_base local_160 [8];
  ios_base local_158 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [208];
  ScopedLogSection section;
  TestLog local_40 [2];
  long lVar11;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar6);
  if (this->m_numIterations < 2) {
    sectionDescription._M_dataplus._M_p = (pointer)&sectionDescription.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sectionDescription,"Test","");
  }
  else {
    iVar6 = this->m_iteration;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::ostream::operator<<((ostringstream *)local_1d0,iVar6 + 1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    std::ios_base::~ios_base(local_160);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&section,0,(char *)0x0,0x1c55407);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_220 = *plVar18;
      lStack_218 = plVar12[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar18;
      local_230 = (long *)*plVar12;
    }
    local_228 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_230);
    puVar19 = (ulong *)(plVar12 + 2);
    if ((ulong *)*plVar12 == puVar19) {
      local_248 = *puVar19;
      lStack_240 = plVar12[3];
      local_258 = &local_248;
    }
    else {
      local_248 = *puVar19;
      local_258 = (ulong *)*plVar12;
    }
    local_250 = plVar12[1];
    *plVar12 = (long)puVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::ostream::operator<<(local_1d0,this->m_numIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
    std::ios_base::~ios_base(local_160);
    uVar26 = 0xf;
    if (local_258 != &local_248) {
      uVar26 = local_248;
    }
    if (uVar26 < (ulong)(local_1e8 + local_250)) {
      uVar26 = 0xf;
      if (local_1f0 != local_1e0) {
        uVar26 = local_1e0[0];
      }
      if (uVar26 < (ulong)(local_1e8 + local_250)) goto LAB_0152c94b;
      pTVar13 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_258);
    }
    else {
LAB_0152c94b:
      pTVar13 = (TextureFormat *)
                std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1f0);
    }
    local_288._0_8_ = &local_278;
    TVar1 = (TextureFormat)(pTVar13 + 2);
    if (*pTVar13 == TVar1) {
      local_278._M_allocated_capacity = *(undefined8 *)TVar1;
      local_278._8_8_ = pTVar13[3];
    }
    else {
      local_278._M_allocated_capacity = *(undefined8 *)TVar1;
      local_288._0_8_ = *pTVar13;
    }
    local_288._8_8_ = pTVar13[1];
    *pTVar13 = TVar1;
    pTVar13[1].order = R;
    pTVar13[1].type = SNORM_INT8;
    *(char *)TVar1 = '\0';
    plVar12 = (long *)std::__cxx11::string::append(local_288);
    psVar3 = &resultImage.m_pixels.m_cap;
    psVar20 = (size_t *)(plVar12 + 2);
    if ((size_t *)*plVar12 == psVar20) {
      resultImage.m_pixels.m_cap = *psVar20;
      aStack_298._M_allocated_capacity = plVar12[3];
      resultImage._0_8_ = psVar3;
    }
    else {
      resultImage.m_pixels.m_cap = *psVar20;
      resultImage._0_8_ = (size_t *)*plVar12;
    }
    resultImage.m_pixels.m_ptr = (void *)plVar12[1];
    *plVar12 = (long)psVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
              (local_1d0,this,(ulong)(uint)this->m_iteration);
    uVar26 = (long)&(local_1c8->_M_dataplus)._M_p + (long)resultImage.m_pixels.m_ptr;
    uVar21 = 0xf;
    if ((size_t *)resultImage._0_8_ != psVar3) {
      uVar21 = resultImage.m_pixels.m_cap;
    }
    if (uVar21 < uVar26) {
      uVar22 = 0xf;
      if (local_1d0 != (undefined1  [8])&local_1c0) {
        uVar22 = local_1c0._M_allocated_capacity;
      }
      if ((ulong)uVar22 < uVar26) goto LAB_0152ca6f;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,resultImage._0_8_);
    }
    else {
LAB_0152ca6f:
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&resultImage,(ulong)local_1d0)
      ;
    }
    sectionDescription._M_dataplus._M_p = (pointer)&sectionDescription.field_2;
    psVar2 = puVar14 + 2;
    if ((size_type *)*puVar14 == psVar2) {
      sectionDescription.field_2._M_allocated_capacity = *psVar2;
      sectionDescription.field_2._8_8_ = puVar14[3];
    }
    else {
      sectionDescription.field_2._M_allocated_capacity = *psVar2;
      sectionDescription._M_dataplus._M_p = (pointer)*puVar14;
    }
    sectionDescription._M_string_length = puVar14[1];
    *puVar14 = psVar2;
    puVar14[1] = 0;
    *(char *)psVar2 = '\0';
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((size_t *)resultImage._0_8_ != psVar3) {
      operator_delete((void *)resultImage._0_8_,resultImage.m_pixels.m_cap + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._0_8_ != &local_278) {
      operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if (section.m_log != local_40) {
      operator_delete(section.m_log,(ulong)((long)&(local_40[0].m_log)->flags + 1));
    }
  }
  pTVar15 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::ostream::operator<<(local_1d0,this->m_iteration);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)local_288,0,(char *)0x0,0x1bc3748);
  psVar3 = &resultImage.m_pixels.m_cap;
  psVar20 = (size_t *)(plVar12 + 2);
  if ((size_t *)*plVar12 == psVar20) {
    resultImage.m_pixels.m_cap = *psVar20;
    aStack_298._M_allocated_capacity = plVar12[3];
    resultImage._0_8_ = psVar3;
  }
  else {
    resultImage.m_pixels.m_cap = *psVar20;
    resultImage._0_8_ = (size_t *)*plVar12;
  }
  resultImage.m_pixels.m_ptr = (void *)plVar12[1];
  *plVar12 = (long)psVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection
            (&section,pTVar15,(string *)&resultImage,&sectionDescription);
  if ((size_t *)resultImage._0_8_ != psVar3) {
    operator_delete((void *)resultImage._0_8_,resultImage.m_pixels.m_cap + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._0_8_ != &local_278) {
    operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
  }
  if (this->m_perIterationShader == true) {
    pSVar4 = this->m_program;
    if (pSVar4 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar4);
    }
    operator_delete(pSVar4,0xd0);
    this->m_program = (ShaderProgram *)0x0;
    local_260 = (ShaderProgram *)operator_new(0xd0);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(local_1d0,0,0xac);
    local_120._0_8_ = (pointer)0x0;
    local_120[8] = 0;
    local_120._9_7_ = 0;
    local_120[0x10] = 0;
    local_120._17_8_ = 0;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
              (&local_258,this,(ulong)(uint)this->m_numTargetSamples);
    resultImage._0_8_ = resultImage._0_8_ & 0xffffffff00000000;
    resultImage.m_pixels.m_ptr = &aStack_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&resultImage.m_pixels,local_258,local_250 + (long)local_258);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d0 + (resultImage._0_8_ & 0xffffffff) * 0x18),
                (value_type *)&resultImage.m_pixels);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
              (&local_230,this,(ulong)(uint)this->m_numTargetSamples);
    local_288._0_4_ = A;
    local_288._8_8_ = (long)local_278._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_288 + 8),local_230,local_228 + (long)local_230);
    pSVar4 = local_260;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d0 + (local_288._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_288 + 8)
               );
    glu::ShaderProgram::ShaderProgram(pSVar4,pRVar5,(ProgramSources *)local_1d0);
    this->m_program = pSVar4;
    if (local_288._8_8_ != (long)local_278._M_local_buf + 8) {
      operator_delete((void *)local_288._8_8_,local_278._8_8_ + 1);
    }
    psVar3 = &resultImage.m_pixels.m_cap;
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resultImage.m_pixels.m_ptr != &aStack_298) {
      operator_delete(resultImage.m_pixels.m_ptr,aStack_298._0_8_ + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_120);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_140);
    lVar24 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d0 + lVar24));
      lVar24 = lVar24 + -0x18;
    } while (lVar24 != -0x18);
    pTVar15 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    resultImage._0_8_ = psVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&resultImage,"RenderShader","");
    local_288._0_8_ = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"Render shader","");
    tcu::LogSection::LogSection((LogSection *)local_1d0,(string *)&resultImage,(string *)local_288);
    tcu::TestLog::startSection(pTVar15,(char *)local_1d0,local_1b0._M_p);
    pTVar15 = glu::operator<<(pTVar15,this->m_program);
    tcu::TestLog::endSection(pTVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_p != local_1a0) {
      operator_delete(local_1b0._M_p,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._0_8_ != &local_278) {
      operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
    }
    if ((size_t *)resultImage._0_8_ != psVar3) {
      operator_delete((void *)resultImage._0_8_,resultImage.m_pixels.m_cap + 1);
    }
    if ((this->m_program->m_program).m_info.linkOk == false) {
      pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
      local_1d0 = (undefined1  [8])&local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"could not build program","");
      tcu::TestError::TestError(pTVar17,(string *)local_1d0);
      __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_renderTarget - TARGET_TEXTURE < 2) {
    (**(code **)(lVar11 + 0x78))(0x8d40,this->m_fbo);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"bind fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x1dc);
    local_1d0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"Rendering ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,(this->m_renderSceneDescription)._M_dataplus._M_p,
               (this->m_renderSceneDescription)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8," with render shader to fbo.",0x1b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1d0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"Rendering ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,(this->m_renderSceneDescription)._M_dataplus._M_p,
               (this->m_renderSceneDescription)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8," with render shader to default framebuffer.",0x2b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
  std::ios_base::~ios_base(local_158);
  (**(code **)(lVar11 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar11 + 0x188))(0x4000);
  (**(code **)(lVar11 + 0x1a00))(0,0,this->m_renderSize);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1e6);
  (**(code **)(lVar11 + 0xd8))(this->m_renderVao);
  (**(code **)(lVar11 + 0x40))(0x8892,this->m_buffer);
  for (p_Var16 = (this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var16 != &(this->m_renderAttribs)._M_t._M_impl.super__Rb_tree_header;
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
    iVar6 = (**(code **)(lVar11 + 0x780))
                      ((this->m_program->m_program).m_program,*(undefined8 *)(p_Var16 + 1));
    if (iVar6 != -1) {
      (**(code **)(lVar11 + 0x19f0))
                (iVar6,4,0x1406,0,*(undefined4 *)&p_Var16[2].field_0x4,p_Var16[2]._M_color);
      (**(code **)(lVar11 + 0x610))(iVar6);
    }
  }
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"set attrib",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1f7);
  (**(code **)(lVar11 + 0x1680))((this->m_program->m_program).m_program);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  (**(code **)(lVar11 + 0x538))(this->m_renderMode,0,this->m_renderCount);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  (**(code **)(lVar11 + 0x1680))(0);
  (**(code **)(lVar11 + 0xd8))(0);
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x1ff);
  RVar8 = this->m_renderTarget;
  if (RVar8 - TARGET_TEXTURE < 2) {
    (**(code **)(lVar11 + 0x78))(0x8d40,0);
    RVar8 = this->m_renderTarget;
  }
  if (RVar8 == TARGET_RENDERBUFFER) {
    tcu::Surface::Surface(&resultImage,this->m_renderSize,this->m_renderSize);
    local_1d0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,
               "Blitting result from fbo to single sample fbo. (Resolve multisample)",0x44);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
    std::ios_base::~ios_base(local_158);
    (**(code **)(lVar11 + 0x78))(0x8ca8,this->m_fbo);
    (**(code **)(lVar11 + 0x78))(0x8ca9,this->m_resolveFbo);
    iVar6 = this->m_renderSize;
    (**(code **)(lVar11 + 0x140))(0,0,iVar6,iVar6,0,0,iVar6,iVar6,0x4000,0x2600);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"blit resolve",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x21f);
    local_1d0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Reading pixels from single sample framebuffer.",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
    std::ios_base::~ios_base(local_158);
    (**(code **)(lVar11 + 0x78))(0x8ca8,this->m_resolveFbo);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_288._0_4_ = RGBA;
    local_288._4_4_ = UNORM_INT8;
    pvVar23 = (void *)resultImage.m_pixels.m_cap;
    if (resultImage.m_pixels.m_cap != 0) {
      pvVar23 = resultImage.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1d0,(TextureFormat *)local_288,resultImage.m_width,
               resultImage.m_height,1,pvVar23);
    glu::readPixels(pRVar5,0,0,(PixelBufferAccess *)local_1d0);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x225);
    (**(code **)(lVar11 + 0x78))(0x8d40,0);
    verifyResultImageAndSetResult(this,&resultImage);
  }
  else if (RVar8 == TARGET_TEXTURE) {
    dVar7 = (this->m_textureSamplerProgram->m_program).m_program;
    if (this->m_verifyTextureSampleBuffers != false) {
      uVar9 = (**(code **)(lVar11 + 0x780))(dVar7,"a_position");
      iVar6 = (**(code **)(lVar11 + 0xb48))
                        ((this->m_textureSamplerProgram->m_program).m_program,"u_sampler");
      uVar10 = (**(code **)(lVar11 + 0xb48))
                         ((this->m_textureSamplerProgram->m_program).m_program,"u_sampleNdx");
      local_260 = (ShaderProgram *)CONCAT44(local_260._4_4_,uVar10);
      uVar10 = 0x9100;
      if (this->m_numRequestedSamples == 0) {
        uVar10 = 0xde1;
      }
      std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::vector
                ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)&resultImage,
                 (long)this->m_numTargetSamples,(allocator_type *)local_1d0);
      if (this->m_numRequestedSamples == 0) {
        local_1d0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c8,"Reading texture.",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1d0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c8,"Reading multisample texture sample buffers.",0x2b);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
      std::ios_base::~ios_base(local_158);
      if (iVar6 == -1) {
        pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
        local_1d0 = (undefined1  [8])&local_1c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d0,"Location u_sampler was -1.","");
        tcu::TestError::TestError(pTVar17,(string *)local_1d0);
        __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_234 = iVar6;
      if ((int)local_260 == -1) {
        pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
        local_1d0 = (undefined1  [8])&local_1c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d0,"Location u_sampleNdx was -1.","");
        tcu::TestError::TestError(pTVar17,(string *)local_1d0);
        __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (0 < this->m_numTargetSamples) {
        lVar24 = 0;
        lVar25 = 0;
        do {
          tcu::Surface::setSize
                    ((Surface *)(resultImage._0_8_ + lVar24),this->m_renderSize,this->m_renderSize);
          lVar25 = lVar25 + 1;
          lVar24 = lVar24 + 0x18;
        } while (lVar25 < this->m_numTargetSamples);
      }
      (**(code **)(lVar11 + 0x1c0))(0,0,0,0x3f800000);
      (**(code **)(lVar11 + 0x188))(0x4000);
      (**(code **)(lVar11 + 0x1a00))(0,0,this->m_renderSize);
      dVar7 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar7,"clear",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                      ,0x278);
      (**(code **)(lVar11 + 0xd8))(this->m_resolveVao);
      (**(code **)(lVar11 + 0x40))(0x8892,this->m_resolveBuffer);
      (**(code **)(lVar11 + 0x19f0))(uVar9,4,0x1406,0,0,0);
      (**(code **)(lVar11 + 0x610))(uVar9);
      dVar7 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar7,"set attrib",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                      ,0x27e);
      (**(code **)(lVar11 + 8))(0x84c0);
      (**(code **)(lVar11 + 0xb8))(uVar10,this->m_fboTexture);
      dVar7 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar7,"bind tex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                      ,0x282);
      (**(code **)(lVar11 + 0x78))(0x8d40,this->m_resolveFbo);
      (**(code **)(lVar11 + 0x1680))((this->m_textureSamplerProgram->m_program).m_program);
      (**(code **)(lVar11 + 0x14f0))(local_234,0);
      local_1d0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,"Reading sample buffers",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
      std::ios_base::~ios_base(local_158);
      if (0 < this->m_numTargetSamples) {
        lVar24 = 0x10;
        uVar26 = 0;
        do {
          (**(code **)(lVar11 + 0x14f0))((ulong)local_260 & 0xffffffff,uVar26 & 0xffffffff);
          (**(code **)(lVar11 + 0x538))(5,0,4);
          dVar7 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar7,"draw",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                          ,0x28e);
          pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
          local_288._0_4_ = RGBA;
          local_288._4_4_ = UNORM_INT8;
          pvVar23 = *(void **)(resultImage._0_8_ + lVar24);
          if (pvVar23 != (void *)0x0) {
            pvVar23 = *(void **)(resultImage._0_8_ + -8 + lVar24);
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_1d0,(TextureFormat *)local_288,
                     *(int *)(resultImage._0_8_ + -0x10 + lVar24),
                     *(int *)(resultImage._0_8_ + -0xc + lVar24),1,pvVar23);
          glu::readPixels(pRVar5,0,0,(PixelBufferAccess *)local_1d0);
          dVar7 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar7,"read pixels",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                          ,0x291);
          uVar26 = uVar26 + 1;
          lVar24 = lVar24 + 0x18;
        } while ((long)uVar26 < (long)this->m_numTargetSamples);
      }
      (**(code **)(lVar11 + 0x1680))(0);
      (**(code **)(lVar11 + 0xd8))(0);
      (**(code **)(lVar11 + 0x78))(0x8d40,0);
      verifyResultBuffersAndSetResult
                (this,(vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)&resultImage);
      std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::~vector
                ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)&resultImage);
      goto LAB_0152d9cd;
    }
    uVar9 = (**(code **)(lVar11 + 0x780))(dVar7,"a_position");
    iVar6 = (**(code **)(lVar11 + 0xb48))
                      ((this->m_textureSamplerProgram->m_program).m_program,"u_sampler");
    uVar10 = 0x9100;
    if (this->m_numRequestedSamples == 0) {
      uVar10 = 0xde1;
    }
    tcu::Surface::Surface(&resultImage,this->m_renderSize,this->m_renderSize);
    if (this->m_numRequestedSamples == 0) {
      local_1d0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "Drawing texture to single sample framebuffer. Using sampler shader.",0x43);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1d0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8,
                 "Using sampler shader to sample the multisample texture to single sample framebuffer."
                 ,0x54);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
    std::ios_base::~ios_base(local_158);
    if (iVar6 == -1) {
      pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
      local_1d0 = (undefined1  [8])&local_1c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"Location u_sampler was -1.","");
      tcu::TestError::TestError(pTVar17,(string *)local_1d0);
      __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar11 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar11 + 0x188))(0x4000);
    (**(code **)(lVar11 + 0x1a00))(0,0,this->m_renderSize);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x23f);
    (**(code **)(lVar11 + 0xd8))(this->m_resolveVao);
    (**(code **)(lVar11 + 0x40))(0x8892,this->m_resolveBuffer);
    (**(code **)(lVar11 + 0x19f0))(uVar9,4,0x1406,0,0,0);
    (**(code **)(lVar11 + 0x610))(uVar9);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"set attrib",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x245);
    (**(code **)(lVar11 + 8))(0x84c0);
    (**(code **)(lVar11 + 0xb8))(uVar10,this->m_fboTexture);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"bind tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x249);
    (**(code **)(lVar11 + 0x1680))((this->m_textureSamplerProgram->m_program).m_program);
    (**(code **)(lVar11 + 0x14f0))(iVar6,0);
    (**(code **)(lVar11 + 0x78))(0x8d40,this->m_resolveFbo);
    (**(code **)(lVar11 + 0x538))(5,0,4);
    (**(code **)(lVar11 + 0x1680))(0);
    (**(code **)(lVar11 + 0xd8))(0);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x253);
    local_1d0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Reading pixels from single sample framebuffer.",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
    std::ios_base::~ios_base(local_158);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_288._0_4_ = RGBA;
    local_288._4_4_ = UNORM_INT8;
    pvVar23 = (void *)resultImage.m_pixels.m_cap;
    if (resultImage.m_pixels.m_cap != 0) {
      pvVar23 = resultImage.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1d0,(TextureFormat *)local_288,resultImage.m_width,
               resultImage.m_height,1,pvVar23);
    glu::readPixels(pRVar5,0,0,(PixelBufferAccess *)local_1d0);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,600);
    (**(code **)(lVar11 + 0x78))(0x8d40,0);
    verifyResultImageAndSetResult(this,&resultImage);
  }
  else {
    if (RVar8 != TARGET_DEFAULT) goto LAB_0152d9cd;
    tcu::Surface::Surface(&resultImage,this->m_renderSize,this->m_renderSize);
    local_1d0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Reading pixels from default framebuffer.",0x28);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
    std::ios_base::~ios_base(local_158);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_288._0_4_ = RGBA;
    local_288._4_4_ = UNORM_INT8;
    pvVar23 = (void *)resultImage.m_pixels.m_cap;
    if (resultImage.m_pixels.m_cap != 0) {
      pvVar23 = resultImage.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1d0,(TextureFormat *)local_288,resultImage.m_width,
               resultImage.m_height,1,pvVar23);
    glu::readPixels(pRVar5,0,0,(PixelBufferAccess *)local_1d0);
    dVar7 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar7,"read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x20f);
    verifyResultImageAndSetResult(this,&resultImage);
  }
  tcu::Surface::~Surface(&resultImage);
LAB_0152d9cd:
  tcu::TestLog::endSection(section.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sectionDescription._M_dataplus._M_p != &sectionDescription.field_2) {
    operator_delete(sectionDescription._M_dataplus._M_p,
                    sectionDescription.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MultisampleRenderCase::drawOneIteration (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const std::string			sectionDescription	= (m_numIterations > 1) ? ("Iteration " + de::toString(m_iteration+1) + "/" + de::toString(m_numIterations) + ": " + getIterationDescription(m_iteration)) : ("Test");
	const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration), sectionDescription);

	// Per iteration shader?
	if (m_perIterationShader)
	{
		delete m_program;
		m_program = DE_NULL;

		m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(genVertexSource(m_numTargetSamples))
			<< glu::FragmentSource(genFragmentSource(m_numTargetSamples)));
		m_testCtx.getLog() << tcu::TestLog::Section("RenderShader", "Render shader") << *m_program << tcu::TestLog::EndSection;
		if (!m_program->isOk())
			throw tcu::TestError("could not build program");

	}

	// render
	{
		if (m_renderTarget == TARGET_TEXTURE || m_renderTarget == TARGET_RENDERBUFFER)
		{
			gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind fbo");

			m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << m_renderSceneDescription << " with render shader to fbo." << tcu::TestLog::EndMessage;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << m_renderSceneDescription << " with render shader to default framebuffer." << tcu::TestLog::EndMessage;

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, m_renderSize, m_renderSize);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

		gl.bindVertexArray(m_renderVao);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);

		// set attribs
		DE_ASSERT(!m_renderAttribs.empty());
		for (std::map<std::string, Attrib>::const_iterator it = m_renderAttribs.begin(); it != m_renderAttribs.end(); ++it)
		{
			const deInt32 location = gl.getAttribLocation(m_program->getProgram(), it->first.c_str());

			if (location != -1)
			{
				gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, it->second.stride, (deUint8*)DE_NULL + it->second.offset);
				gl.enableVertexAttribArray(location);
			}
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

		gl.useProgram(m_program->getProgram());
		preDraw();
		gl.drawArrays(m_renderMode, 0, m_renderCount);
		postDraw();
		gl.useProgram(0);
		gl.bindVertexArray(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

		if (m_renderTarget == TARGET_TEXTURE || m_renderTarget == TARGET_RENDERBUFFER)
			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	}

	// read
	{
		if (m_renderTarget == TARGET_DEFAULT)
		{
			tcu::Surface resultImage(m_renderSize, m_renderSize);

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from default framebuffer." << tcu::TestLog::EndMessage;

			// default directly
			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_RENDERBUFFER)
		{
			tcu::Surface resultImage(m_renderSize, m_renderSize);

			// rbo by blitting to non-multisample fbo

			m_testCtx.getLog() << tcu::TestLog::Message << "Blitting result from fbo to single sample fbo. (Resolve multisample)" << tcu::TestLog::EndMessage;

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo);
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_resolveFbo);
			gl.blitFramebuffer(0, 0, m_renderSize, m_renderSize, 0, 0, m_renderSize, m_renderSize, GL_COLOR_BUFFER_BIT, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "blit resolve");

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from single sample framebuffer." << tcu::TestLog::EndMessage;

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_resolveFbo);
			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_TEXTURE && !m_verifyTextureSampleBuffers)
		{
			const deInt32	posLocation		= gl.getAttribLocation(m_textureSamplerProgram->getProgram(), "a_position");
			const deInt32	samplerLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampler");
			const deUint32	textureTarget	= (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);
			tcu::Surface	resultImage		(m_renderSize, m_renderSize);

			if (m_numRequestedSamples)
				m_testCtx.getLog() << tcu::TestLog::Message << "Using sampler shader to sample the multisample texture to single sample framebuffer." << tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Drawing texture to single sample framebuffer. Using sampler shader." << tcu::TestLog::EndMessage;

			if (samplerLocation == -1)
				throw tcu::TestError("Location u_sampler was -1.");

			// resolve multisample texture by averaging
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			gl.viewport(0, 0, m_renderSize, m_renderSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.bindVertexArray(m_resolveVao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(textureTarget, m_fboTexture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind tex");

			gl.useProgram(m_textureSamplerProgram->getProgram());
			gl.uniform1i(samplerLocation, 0);

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
			gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);

			gl.useProgram(0);
			gl.bindVertexArray(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading pixels from single sample framebuffer." << tcu::TestLog::EndMessage;

			glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// set test result
			verifyResultImageAndSetResult(resultImage);
		}
		else if (m_renderTarget == TARGET_TEXTURE && m_verifyTextureSampleBuffers)
		{
			const deInt32				posLocation		= gl.getAttribLocation(m_textureSamplerProgram->getProgram(), "a_position");
			const deInt32				samplerLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampler");
			const deInt32				sampleLocation	= gl.getUniformLocation(m_textureSamplerProgram->getProgram(), "u_sampleNdx");
			const deUint32				textureTarget	= (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);
			std::vector<tcu::Surface>	resultBuffers	(m_numTargetSamples);

			if (m_numRequestedSamples)
				m_testCtx.getLog() << tcu::TestLog::Message << "Reading multisample texture sample buffers." << tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog() << tcu::TestLog::Message << "Reading texture." << tcu::TestLog::EndMessage;

			if (samplerLocation == -1)
				throw tcu::TestError("Location u_sampler was -1.");
			if (sampleLocation == -1)
				throw tcu::TestError("Location u_sampleNdx was -1.");

			for (int sampleNdx = 0; sampleNdx < m_numTargetSamples; ++sampleNdx)
				resultBuffers[sampleNdx].setSize(m_renderSize, m_renderSize);

			// read sample buffers to different surfaces
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			gl.viewport(0, 0, m_renderSize, m_renderSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.bindVertexArray(m_resolveVao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "set attrib");

			gl.activeTexture(GL_TEXTURE0);
			gl.bindTexture(textureTarget, m_fboTexture);
			GLU_EXPECT_NO_ERROR(gl.getError(), "bind tex");

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
			gl.useProgram(m_textureSamplerProgram->getProgram());
			gl.uniform1i(samplerLocation, 0);

			m_testCtx.getLog() << tcu::TestLog::Message << "Reading sample buffers" << tcu::TestLog::EndMessage;

			for (int sampleNdx = 0; sampleNdx < m_numTargetSamples; ++sampleNdx)
			{
				gl.uniform1i(sampleLocation, sampleNdx);
				gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

				glu::readPixels(m_context.getRenderContext(), 0, 0, resultBuffers[sampleNdx].getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");
			}

			gl.useProgram(0);
			gl.bindVertexArray(0);
			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);

			// verify sample buffers
			verifyResultBuffersAndSetResult(resultBuffers);
		}
		else
			DE_ASSERT(false);
	}
}